

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedNumberFormat::initCapitalizationContextInfo
          (RuleBasedNumberFormat *this,Locale *thelocale)

{
  UBool UVar1;
  int32_t *piVar2;
  char *local_158;
  int32_t *intVector;
  UResourceBundle *pUStack_118;
  int32_t len;
  UResourceBundle *rb;
  UErrorCode status;
  Locale local_100;
  char *local_20;
  char *localeID;
  Locale *thelocale_local;
  RuleBasedNumberFormat *this_local;
  
  localeID = (char *)thelocale;
  thelocale_local = (Locale *)this;
  Locale::Locale(&local_100,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  UVar1 = Locale::operator!=(thelocale,&local_100);
  if (UVar1 == '\0') {
    local_158 = (char *)0x0;
  }
  else {
    local_158 = Locale::getBaseName((Locale *)localeID);
  }
  Locale::~Locale(&local_100);
  local_20 = local_158;
  rb._0_4_ = U_ZERO_ERROR;
  pUStack_118 = ures_open_63((char *)0x0,local_158,(UErrorCode *)&rb);
  pUStack_118 = ures_getByKeyWithFallback_63
                          (pUStack_118,"contextTransforms",pUStack_118,(UErrorCode *)&rb);
  pUStack_118 = ures_getByKeyWithFallback_63
                          (pUStack_118,"number-spellout",pUStack_118,(UErrorCode *)&rb);
  UVar1 = ::U_SUCCESS((UErrorCode)rb);
  if ((UVar1 != '\0') && (pUStack_118 != (UResourceBundle *)0x0)) {
    intVector._4_4_ = 0;
    piVar2 = ures_getIntVector_63(pUStack_118,(int32_t *)((long)&intVector + 4),(UErrorCode *)&rb);
    UVar1 = ::U_SUCCESS((UErrorCode)rb);
    if ((UVar1 != '\0') && ((piVar2 != (int32_t *)0x0 && (1 < intVector._4_4_)))) {
      this->capitalizationForUIListMenu = (UBool)*piVar2;
      this->capitalizationForStandAlone = (UBool)piVar2[1];
    }
  }
  ures_close_63(pUStack_118);
  return;
}

Assistant:

void
RuleBasedNumberFormat::initCapitalizationContextInfo(const Locale& thelocale)
{
#if !UCONFIG_NO_BREAK_ITERATION
    const char * localeID = (thelocale != NULL)? thelocale.getBaseName(): NULL;
    UErrorCode status = U_ZERO_ERROR;
    UResourceBundle *rb = ures_open(NULL, localeID, &status);
    rb = ures_getByKeyWithFallback(rb, "contextTransforms", rb, &status);
    rb = ures_getByKeyWithFallback(rb, "number-spellout", rb, &status);
    if (U_SUCCESS(status) && rb != NULL) {
        int32_t len = 0;
        const int32_t * intVector = ures_getIntVector(rb, &len, &status);
        if (U_SUCCESS(status) && intVector != NULL && len >= 2) {
            capitalizationForUIListMenu = static_cast<UBool>(intVector[0]);
            capitalizationForStandAlone = static_cast<UBool>(intVector[1]);
        }
    }
    ures_close(rb);
#endif
}